

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O0

void __thiscall soul::RenderingVenue::Pimpl::removeActiveSession(Pimpl *this,SessionImpl *session)

{
  anon_class_8_1_f9aab576_for__M_pred local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> l;
  SessionImpl *session_local;
  Pimpl *this_local;
  
  l._M_device = (mutex_type *)session;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->sessionListLock);
  local_28.session = (SessionImpl *)l._M_device;
  removeIf<std::vector<soul::RenderingVenue::Pimpl::SessionImpl*,std::allocator<soul::RenderingVenue::Pimpl::SessionImpl*>>,soul::RenderingVenue::Pimpl::removeActiveSession(soul::RenderingVenue::Pimpl::SessionImpl&)::_lambda(soul::RenderingVenue::Pimpl::SessionImpl*)_1_>
            (&this->activeSessions,&local_28);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void removeActiveSession (SessionImpl& session)
    {
        std::lock_guard<std::mutex> l (sessionListLock);
        removeIf (activeSessions, [&] (SessionImpl* s) { return s == std::addressof (session); });
    }